

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

void common_params_print_completion(common_params_context *ctx_arg)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  undefined8 uVar2;
  long in_RDI;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *exe;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  executables;
  anon_class_1_0_00000001 print_options;
  common_arg *opt;
  iterator __end1;
  iterator __begin1;
  vector<common_arg,_std::allocator<common_arg>_> *__range1;
  vector<common_arg_*,_std::allocator<common_arg_*>_> specific_options;
  vector<common_arg_*,_std::allocator<common_arg_*>_> sparam_options;
  vector<common_arg_*,_std::allocator<common_arg_*>_> common_options;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff6f8;
  vector<common_arg_*,_std::allocator<common_arg_*>_> *in_stack_fffffffffffff700;
  llama_example in_stack_fffffffffffff70c;
  common_arg *in_stack_fffffffffffff710;
  allocator<char> *in_stack_fffffffffffff730;
  vector<common_arg_*,_std::allocator<common_arg_*>_> *in_stack_fffffffffffff738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__comp;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  iterator pbVar3;
  undefined1 *puVar4;
  _Self local_630;
  _Self local_628;
  undefined1 *local_620;
  undefined1 local_611;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_610;
  undefined1 local_60f [2];
  allocator<char> local_60d;
  allocator<char> local_60c;
  allocator<char> local_60b;
  allocator<char> local_60a;
  allocator<char> local_609;
  allocator<char> local_608;
  allocator<char> local_607;
  allocator<char> local_606;
  allocator<char> local_605;
  allocator<char> local_604;
  allocator<char> local_603;
  allocator<char> local_602;
  allocator<char> local_601;
  allocator<char> local_600;
  allocator<char> local_5ff;
  allocator<char> local_5fe;
  allocator<char> local_5fd;
  allocator<char> local_5fc;
  allocator<char> local_5fb;
  allocator<char> local_5fa;
  allocator<char> local_5f9;
  allocator<char> local_5f8;
  allocator<char> local_5f7;
  allocator<char> local_5f6;
  allocator<char> local_5f5;
  allocator<char> local_5f4;
  allocator<char> local_5f3;
  allocator<char> local_5f2;
  allocator<char> local_5f1;
  allocator<char> local_5f0;
  allocator<char> local_5ef;
  allocator<char> local_5ee;
  allocator<char> local_5ed;
  allocator<char> local_5ec;
  allocator<char> local_5eb;
  allocator<char> local_5ea;
  allocator<char> local_5e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5e8;
  string local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [64];
  string *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [56];
  reference local_98;
  reference local_90;
  reference local_78;
  reference local_70;
  common_arg *local_68;
  __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_> local_60;
  long local_58;
  long local_8;
  
  local_8 = in_RDI;
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)0x199fac);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)0x199fb9);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)0x199fc6);
  local_58 = local_8 + 0x10;
  local_60._M_current =
       (common_arg *)
       std::vector<common_arg,_std::allocator<common_arg>_>::begin
                 ((vector<common_arg,_std::allocator<common_arg>_> *)in_stack_fffffffffffff6f8);
  local_68 = (common_arg *)
             std::vector<common_arg,_std::allocator<common_arg>_>::end
                       ((vector<common_arg,_std::allocator<common_arg>_> *)in_stack_fffffffffffff6f8
                       );
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
                             *)in_stack_fffffffffffff700,
                            (__normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
                             *)in_stack_fffffffffffff6f8), bVar1) {
    local_70 = __gnu_cxx::
               __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
               ::operator*(&local_60);
    if ((local_70->is_sparam & 1U) == 0) {
      bVar1 = common_arg::in_example(in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
      if (bVar1) {
        local_90 = local_70;
        std::vector<common_arg_*,_std::allocator<common_arg_*>_>::push_back
                  (in_stack_fffffffffffff700,(value_type *)in_stack_fffffffffffff6f8);
      }
      else {
        local_98 = local_70;
        std::vector<common_arg_*,_std::allocator<common_arg_*>_>::push_back
                  (in_stack_fffffffffffff700,(value_type *)in_stack_fffffffffffff6f8);
      }
    }
    else {
      local_78 = local_70;
      std::vector<common_arg_*,_std::allocator<common_arg_*>_>::push_back
                (in_stack_fffffffffffff700,(value_type *)in_stack_fffffffffffff6f8);
    }
    __gnu_cxx::
    __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>::
    operator++(&local_60);
  }
  printf("_llama_completions() {\n");
  printf("    local cur prev opts\n");
  printf("    COMPREPLY=()\n");
  printf("    cur=\"${COMP_WORDS[COMP_CWORD]}\"\n");
  printf("    prev=\"${COMP_WORDS[COMP_CWORD-1]}\"\n\n");
  printf("    opts=\"");
  common_params_print_completion::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  common_params_print_completion::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  common_params_print_completion::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  printf("\"\n\n");
  printf("    case \"$prev\" in\n");
  printf("        --model)\n");
  printf(
        "            COMPREPLY=( $(compgen -f -X \'!*.gguf\' -- \"$cur\") $(compgen -d -- \"$cur\") )\n"
        );
  printf("            return 0\n");
  printf("            ;;\n");
  printf("        --grammar-file)\n");
  printf(
        "            COMPREPLY=( $(compgen -f -X \'!*.gbnf\' -- \"$cur\") $(compgen -d -- \"$cur\") )\n"
        );
  printf("            return 0\n");
  printf("            ;;\n");
  printf("        --chat-template-file)\n");
  printf(
        "            COMPREPLY=( $(compgen -f -X \'!*.jinja\' -- \"$cur\") $(compgen -d -- \"$cur\") )\n"
        );
  printf("            return 0\n");
  printf("            ;;\n");
  printf("        *)\n");
  printf("            COMPREPLY=( $(compgen -W \"${opts}\" -- \"$cur\") )\n");
  printf("            return 0\n");
  printf("            ;;\n");
  printf("    esac\n");
  printf("}\n\n");
  local_611 = 1;
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  puVar4 = local_140;
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  this_01 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120;
  pbVar3 = (iterator)local_60f;
  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff740,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_120 + 0x20);
  __comp = &local_610;
  local_5e8 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_611 = 0;
  local_e0 = local_5e0;
  local_d8 = 0x28;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x19aed3);
  __l._M_len = (size_type)puVar4;
  __l._M_array = pbVar3;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(this_01,__l,__comp,(allocator_type *)this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x19af0c);
  this = (string *)&local_e0;
  do {
    this = this + -0x20;
    std::__cxx11::string::~string(this);
  } while (this != local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_610);
  std::allocator<char>::~allocator((allocator<char> *)local_60f);
  std::allocator<char>::~allocator((allocator<char> *)(local_60f + 1));
  std::allocator<char>::~allocator(&local_60d);
  std::allocator<char>::~allocator(&local_60c);
  std::allocator<char>::~allocator(&local_60b);
  std::allocator<char>::~allocator(&local_60a);
  std::allocator<char>::~allocator(&local_609);
  std::allocator<char>::~allocator(&local_608);
  std::allocator<char>::~allocator(&local_607);
  std::allocator<char>::~allocator(&local_606);
  std::allocator<char>::~allocator(&local_605);
  std::allocator<char>::~allocator(&local_604);
  std::allocator<char>::~allocator(&local_603);
  std::allocator<char>::~allocator(&local_602);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::~allocator(&local_600);
  std::allocator<char>::~allocator(&local_5ff);
  std::allocator<char>::~allocator(&local_5fe);
  std::allocator<char>::~allocator(&local_5fd);
  std::allocator<char>::~allocator(&local_5fc);
  std::allocator<char>::~allocator(&local_5fb);
  std::allocator<char>::~allocator(&local_5fa);
  std::allocator<char>::~allocator(&local_5f9);
  std::allocator<char>::~allocator(&local_5f8);
  std::allocator<char>::~allocator(&local_5f7);
  std::allocator<char>::~allocator(&local_5f6);
  std::allocator<char>::~allocator(&local_5f5);
  std::allocator<char>::~allocator(&local_5f4);
  std::allocator<char>::~allocator(&local_5f3);
  std::allocator<char>::~allocator(&local_5f2);
  std::allocator<char>::~allocator(&local_5f1);
  std::allocator<char>::~allocator(&local_5f0);
  std::allocator<char>::~allocator(&local_5ef);
  std::allocator<char>::~allocator(&local_5ee);
  std::allocator<char>::~allocator(&local_5ed);
  std::allocator<char>::~allocator(&local_5ec);
  std::allocator<char>::~allocator(&local_5eb);
  std::allocator<char>::~allocator(&local_5ea);
  std::allocator<char>::~allocator(&local_5e9);
  local_620 = local_d0;
  local_628._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffff6f8);
  local_630._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(in_stack_fffffffffffff6f8);
  while (bVar1 = std::operator!=(&local_628,&local_630), bVar1) {
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x19b1b8);
    uVar2 = std::__cxx11::string::c_str();
    printf("complete -F _llama_completions %s\n",uVar2);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff700);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x19b8c2);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::~vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_fffffffffffff710);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::~vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_fffffffffffff710);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::~vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_fffffffffffff710);
  return;
}

Assistant:

static void common_params_print_completion(common_params_context & ctx_arg) {
    std::vector<common_arg *> common_options;
    std::vector<common_arg *> sparam_options;
    std::vector<common_arg *> specific_options;

    for (auto & opt : ctx_arg.options) {
        if (opt.is_sparam) {
            sparam_options.push_back(&opt);
        } else if (opt.in_example(ctx_arg.ex)) {
            specific_options.push_back(&opt);
        } else {
            common_options.push_back(&opt);
        }
    }

    printf("_llama_completions() {\n");
    printf("    local cur prev opts\n");
    printf("    COMPREPLY=()\n");
    printf("    cur=\"${COMP_WORDS[COMP_CWORD]}\"\n");
    printf("    prev=\"${COMP_WORDS[COMP_CWORD-1]}\"\n\n");

    printf("    opts=\"");
    auto print_options = [](const std::vector<common_arg *> & options) {
        for (const common_arg * opt : options) {
            for (const char * arg : opt->args) {
                printf("%s ", arg);
            }
        }
    };

    print_options(common_options);
    print_options(sparam_options);
    print_options(specific_options);
    printf("\"\n\n");

    printf("    case \"$prev\" in\n");
    printf("        --model)\n");
    printf("            COMPREPLY=( $(compgen -f -X '!*.gguf' -- \"$cur\") $(compgen -d -- \"$cur\") )\n");
    printf("            return 0\n");
    printf("            ;;\n");
    printf("        --grammar-file)\n");
    printf("            COMPREPLY=( $(compgen -f -X '!*.gbnf' -- \"$cur\") $(compgen -d -- \"$cur\") )\n");
    printf("            return 0\n");
    printf("            ;;\n");
    printf("        --chat-template-file)\n");
    printf("            COMPREPLY=( $(compgen -f -X '!*.jinja' -- \"$cur\") $(compgen -d -- \"$cur\") )\n");
    printf("            return 0\n");
    printf("            ;;\n");
    printf("        *)\n");
    printf("            COMPREPLY=( $(compgen -W \"${opts}\" -- \"$cur\") )\n");
    printf("            return 0\n");
    printf("            ;;\n");
    printf("    esac\n");
    printf("}\n\n");

    std::set<std::string> executables = {
        "llama-batched",
        "llama-batched-bench",
        "llama-bench",
        "llama-cli",
        "llama-convert-llama2c-to-ggml",
        "llama-cvector-generator",
        "llama-embedding",
        "llama-eval-callback",
        "llama-export-lora",
        "llama-gen-docs",
        "llama-gguf",
        "llama-gguf-hash",
        "llama-gguf-split",
        "llama-gritlm",
        "llama-imatrix",
        "llama-infill",
        "llama-mtmd-cli",
        "llama-llava-clip-quantize-cli",
        "llama-lookahead",
        "llama-lookup",
        "llama-lookup-create",
        "llama-lookup-merge",
        "llama-lookup-stats",
        "llama-parallel",
        "llama-passkey",
        "llama-perplexity",
        "llama-q8dot",
        "llama-quantize",
        "llama-qwen2vl-cli",
        "llama-retrieval",
        "llama-run",
        "llama-save-load-state",
        "llama-server",
        "llama-simple",
        "llama-simple-chat",
        "llama-speculative",
        "llama-speculative-simple",
        "llama-tokenize",
        "llama-tts",
        "llama-vdot"
    };

    for (const auto& exe : executables) {
        printf("complete -F _llama_completions %s\n", exe.c_str());
    }
}